

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManCreate(Tim_Man_t *p,void *pLib,Vec_Flt_t *vInArrs,Vec_Flt_t *vOutReqs)

{
  int iVar1;
  int iVar2;
  Tim_Obj_t *pTVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  void **ppvVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  
  if (p->vDelayTables != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDelayTables == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x19e,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
  }
  if (pLib == (void *)0x0) {
    pVVar6 = Vec_PtrAlloc(100);
  }
  else {
    pVVar6 = Vec_PtrStart(*(int *)(*(long *)((long)pLib + 8) + 4));
  }
  p->vDelayTables = pVVar6;
  pVVar6 = p->vBoxes;
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    for (iVar14 = 0; iVar14 < pVVar6->nSize; iVar14 = iVar14 + 1) {
      pvVar7 = Vec_PtrEntry(pVVar6,iVar14);
      iVar5 = *(int *)((long)pvVar7 + 0x10);
      if ((pLib == (void *)0x0) || (iVar5 == -1)) {
        iVar1 = *(int *)((long)pvVar7 + 8);
        iVar2 = *(int *)((long)pvVar7 + 0xc);
        uVar4 = iVar2 * iVar1;
        puVar10 = (undefined8 *)malloc((long)(int)uVar4 * 4 + 0xc);
        *puVar10 = CONCAT44((float)iVar1,(float)iVar5);
        *(float *)(puVar10 + 1) = (float)iVar2;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
          *(undefined4 *)((long)puVar10 + uVar12 * 4 + 0xc) = 0x3f800000;
        }
        pVVar6 = p->vDelayTables;
        iVar5 = pVVar6->nSize;
        *(int *)((long)pvVar7 + 0x10) = iVar5;
        if (iVar5 == pVVar6->nCap) {
          uVar4 = iVar5 * 2;
          if (iVar5 < 0x10) {
            uVar4 = 0x10;
          }
          if (iVar5 < (int)uVar4) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar4 << 3);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar6->pArray,(ulong)uVar4 << 3);
              iVar5 = pVVar6->nSize;
            }
            pVVar6->pArray = ppvVar11;
            pVVar6->nCap = uVar4;
          }
        }
        pVVar6->nSize = iVar5 + 1;
        pVVar6->pArray[iVar5] = puVar10;
      }
      else {
        if ((iVar5 < 0) || ((*(Vec_Ptr_t **)((long)pLib + 8))->nSize <= iVar5)) {
          __assert_fail("pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b1,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        pvVar8 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pLib + 8),iVar5);
        if (pvVar8 == (void *)0x0) {
          __assert_fail("pIfBox != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b3,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        if (*(int *)((long)pvVar8 + 0x10) != *(int *)((long)pvVar7 + 8)) {
          __assert_fail("pIfBox->nPis == pBox->nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b4,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        if (*(int *)((long)pvVar8 + 0x14) != *(int *)((long)pvVar7 + 0xc)) {
          __assert_fail("pIfBox->nPos == pBox->nOutputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x1b5,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
        }
        *(int *)((long)pvVar7 + 0x18) = (int)*(char *)((long)pvVar8 + 9);
        pvVar9 = Vec_PtrEntry(p->vDelayTables,*(int *)((long)pvVar7 + 0x10));
        if (pvVar9 == (void *)0x0) {
          iVar5 = *(int *)((long)pvVar7 + 8);
          iVar1 = *(int *)((long)pvVar7 + 0xc);
          uVar4 = iVar1 * iVar5;
          puVar10 = (undefined8 *)malloc((long)(int)uVar4 * 4 + 0xc);
          iVar2 = *(int *)((long)pvVar7 + 0x10);
          *puVar10 = CONCAT44((float)iVar5,(float)iVar2);
          *(float *)(puVar10 + 1) = (float)iVar1;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)puVar10 + uVar12 * 4 + 0xc) =
                 (float)*(int *)(*(long *)((long)pvVar8 + 0x18) + uVar12 * 4);
          }
          Vec_PtrWriteEntry(p->vDelayTables,iVar2,puVar10);
        }
      }
      pVVar6 = p->vBoxes;
    }
  }
  if (vInArrs != (Vec_Flt_t *)0x0) {
    iVar14 = vInArrs->nSize;
    iVar5 = Tim_ManPiNum(p);
    if (iVar14 != iVar5) {
      __assert_fail("Vec_FltSize(vInArrs) == Tim_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1c6,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    lVar15 = 0x10;
    lVar13 = 0;
    while ((lVar13 < p->nCis && (pTVar3 = p->pCis, pTVar3 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)pTVar3 + lVar15 + -8) < 0) {
        fVar16 = Vec_FltEntry(vInArrs,(int)lVar13);
        *(float *)((long)&pTVar3->Id + lVar15) = fVar16;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x18;
    }
  }
  if (vOutReqs != (Vec_Flt_t *)0x0) {
    iVar14 = vOutReqs->nSize;
    iVar5 = Tim_ManPoNum(p);
    if (iVar14 != iVar5) {
      __assert_fail("Vec_FltSize(vOutReqs) == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1cf,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
    lVar13 = 0;
    lVar15 = 0x14;
    iVar14 = 0;
    while ((lVar13 < p->nCos && (pTVar3 = p->pCos, pTVar3 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)pTVar3 + lVar15 + -0xc) < 0) {
        fVar16 = Vec_FltEntry(vOutReqs,iVar14);
        *(float *)((long)&pTVar3->Id + lVar15) = fVar16;
        iVar14 = iVar14 + 1;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x18;
    }
    iVar5 = Tim_ManPoNum(p);
    if (iVar14 != iVar5) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                    ,0x1d2,"void Tim_ManCreate(Tim_Man_t *, void *, Vec_Flt_t *, Vec_Flt_t *)");
    }
  }
  return;
}

Assistant:

void Tim_ManCreate( Tim_Man_t * p, void * pLib, Vec_Flt_t * vInArrs, Vec_Flt_t * vOutReqs )
{
    If_LibBox_t * pLibBox = (If_LibBox_t *)pLib;
    If_Box_t * pIfBox;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pTable;
    int i, k;
    assert( p->vDelayTables == NULL );
    p->vDelayTables = pLibBox ? Vec_PtrStart( Vec_PtrSize(pLibBox->vBoxes) ) : Vec_PtrAlloc( 100 );
    if ( p->vBoxes )
    Tim_ManForEachBox( p, pBox, i )
    {
        if ( pBox->iDelayTable == -1 || pLibBox == NULL )
        {
            // create table with constants
            pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
            pTable[0] = pBox->iDelayTable;
            pTable[1] = pBox->nInputs;
            pTable[2] = pBox->nOutputs;
            for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
                pTable[3 + k] = 1.0;
            // save table
            pBox->iDelayTable = Vec_PtrSize(p->vDelayTables);
            Vec_PtrPush( p->vDelayTables, pTable );
            continue;
        }
        assert( pBox->iDelayTable >= 0 && pBox->iDelayTable < Vec_PtrSize(pLibBox->vBoxes) );
        pIfBox = (If_Box_t *)Vec_PtrEntry( pLibBox->vBoxes, pBox->iDelayTable );
        assert( pIfBox != NULL );
        assert( pIfBox->nPis == pBox->nInputs );
        assert( pIfBox->nPos == pBox->nOutputs );
        pBox->fBlack = pIfBox->fBlack;
        if ( Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable ) != NULL )
            continue;
        // create table of boxes
        pTable = ABC_ALLOC( float, 3 + pBox->nInputs * pBox->nOutputs );
        pTable[0] = pBox->iDelayTable;
        pTable[1] = pBox->nInputs;
        pTable[2] = pBox->nOutputs;
        for ( k = 0; k < pBox->nInputs * pBox->nOutputs; k++ )
            pTable[3 + k] = pIfBox->pDelays[k];
        // save table
        Vec_PtrWriteEntry( p->vDelayTables, pBox->iDelayTable, pTable );
    }
    // create arrival times
    if ( vInArrs )
    {
        assert( Vec_FltSize(vInArrs) == Tim_ManPiNum(p) );
        Tim_ManForEachPi( p, pObj, i )
            pObj->timeArr = Vec_FltEntry(vInArrs, i);

    }
    // create required times
    if ( vOutReqs )
    {
        k = 0;
        assert( Vec_FltSize(vOutReqs) == Tim_ManPoNum(p) );
        Tim_ManForEachPo( p, pObj, i )
            pObj->timeReq = Vec_FltEntry(vOutReqs, k++);
        assert( k == Tim_ManPoNum(p) );
    }
}